

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O0

void stl_string_pointer_is_not_null(void)

{
  string *psVar1;
  string *psVar2;
  int line;
  allocator *file;
  allocator local_1;
  
  psVar1 = (string *)operator_new(0x20);
  file = &local_1;
  psVar2 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)psVar2,"bob",file);
  bob_pointer_abi_cxx11_ = psVar1;
  line = (int)((ulong)psVar2 >> 0x20);
  psVar2 = bob_pointer_abi_cxx11_;
  std::allocator<char>::~allocator((allocator<char> *)&local_1);
  psVar1 = bob_pointer_abi_cxx11_;
  create_not_null_constraint();
  cgreen::assert_that_<std::__cxx11::string*>
            ((char *)file,line,(char *)psVar2,psVar1,(Constraint *)0x12410e);
  return;
}

Assistant:

Ensure(stl_string_pointer_is_not_null) {
    bob_pointer = new std::string("bob");

    assert_that(bob_pointer, is_non_null);
}